

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall
setup::info::load_entries<setup::task_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::task_entry,_std::allocator<setup::task_entry>_> *result,enum_type entry_type
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer this_00;
  long lVar5;
  task_entry entry;
  task_entry local_140;
  
  ptVar3 = (result->super__Vector_base<setup::task_entry,_std::allocator<setup::task_entry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ptVar4 = (result->super__Vector_base<setup::task_entry,_std::allocator<setup::task_entry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = ptVar3;
  if (ptVar4 != ptVar3) {
    do {
      item::~item((item *)this_00);
      this_00 = this_00 + 1;
    } while (this_00 != ptVar4);
    (result->super__Vector_base<setup::task_entry,_std::allocator<setup::task_entry>_>)._M_impl.
    super__Vector_impl_data._M_finish = ptVar3;
  }
  if (NoUnknownVersion < entry_type) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)entry_type
               ,0x15);
  }
  if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w >> ((ulong)entry_type & 0x3f) & 1) == 0) {
    if (count != 0) {
      paVar1 = &local_140.languages.field_2;
      paVar2 = &local_140.check.field_2;
      do {
        local_140.name._M_dataplus._M_p = (pointer)&local_140.name.field_2;
        local_140.name._M_string_length = 0;
        local_140.name.field_2._M_local_buf[0] = '\0';
        local_140.description._M_dataplus._M_p = (pointer)&local_140.description.field_2;
        local_140.description._M_string_length = 0;
        local_140.description.field_2._M_local_buf[0] = '\0';
        local_140.group_description._M_dataplus._M_p = (pointer)&local_140.group_description.field_2
        ;
        local_140.group_description._M_string_length = 0;
        local_140.group_description.field_2._M_local_buf[0] = '\0';
        local_140.components._M_dataplus._M_p = (pointer)&local_140.components.field_2;
        local_140.components._M_string_length = 0;
        local_140.components.field_2._M_local_buf[0] = '\0';
        local_140.languages._M_string_length = 0;
        local_140.languages.field_2._M_local_buf[0] = '\0';
        local_140.check._M_string_length = 0;
        local_140.check.field_2._M_local_buf[0] = '\0';
        local_140.options._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
        local_140.languages._M_dataplus._M_p = (pointer)paVar1;
        local_140.check._M_dataplus._M_p = (pointer)paVar2;
        task_entry::load(&local_140,is,this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.check._M_dataplus._M_p != paVar2) {
          operator_delete(local_140.check._M_dataplus._M_p,
                          CONCAT71(local_140.check.field_2._M_allocated_capacity._1_7_,
                                   local_140.check.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.languages._M_dataplus._M_p != paVar1) {
          operator_delete(local_140.languages._M_dataplus._M_p,
                          CONCAT71(local_140.languages.field_2._M_allocated_capacity._1_7_,
                                   local_140.languages.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.components._M_dataplus._M_p != &local_140.components.field_2) {
          operator_delete(local_140.components._M_dataplus._M_p,
                          CONCAT71(local_140.components.field_2._M_allocated_capacity._1_7_,
                                   local_140.components.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.group_description._M_dataplus._M_p != &local_140.group_description.field_2)
        {
          operator_delete(local_140.group_description._M_dataplus._M_p,
                          CONCAT71(local_140.group_description.field_2._M_allocated_capacity._1_7_,
                                   local_140.group_description.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.description._M_dataplus._M_p != &local_140.description.field_2) {
          operator_delete(local_140.description._M_dataplus._M_p,
                          CONCAT71(local_140.description.field_2._M_allocated_capacity._1_7_,
                                   local_140.description.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.name._M_dataplus._M_p != &local_140.name.field_2) {
          operator_delete(local_140.name._M_dataplus._M_p,
                          CONCAT71(local_140.name.field_2._M_allocated_capacity._1_7_,
                                   local_140.name.field_2._M_local_buf[0]) + 1);
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    std::vector<setup::task_entry,_std::allocator<setup::task_entry>_>::resize(result,count);
    if (count != 0) {
      lVar5 = 0;
      do {
        task_entry::load((task_entry *)
                         ((long)&(((result->
                                   super__Vector_base<setup::task_entry,_std::allocator<setup::task_entry>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar5),is,this);
        lVar5 = lVar5 + 0x110;
        count = count - 1;
      } while (count != 0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}